

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEnableTestingCommand.h
# Opt level: O0

cmCommand * __thiscall cmEnableTestingCommand::Clone(cmEnableTestingCommand *this)

{
  cmCommand *this_00;
  cmEnableTestingCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmEnableTestingCommand((cmEnableTestingCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmEnableTestingCommand; }